

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O0

YV12_BUFFER_CONFIG *
av1_realloc_and_scale_if_required
          (AV1_COMMON *cm,YV12_BUFFER_CONFIG *unscaled,YV12_BUFFER_CONFIG *scaled,
          InterpFilter filter,int phase,_Bool use_optimized_scaler,_Bool for_psnr,
          int border_in_pixels,_Bool alloc_pyramid)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  InterpFilter in_CL;
  YV12_BUFFER_CONFIG *in_RDX;
  YV12_BUFFER_CONFIG *in_RSI;
  AV1_COMMON *in_RDI;
  int in_R8D;
  byte in_R9B;
  bool bVar6;
  byte in_stack_00000008;
  byte in_stack_00000018;
  _Bool in_stack_00000053;
  int in_stack_00000054;
  _Bool has_optimized_scaler;
  SequenceHeader *seq_params;
  int in_stack_00000060;
  int num_planes;
  _Bool scaling_required;
  YV12_BUFFER_CONFIG *in_stack_00000068;
  int scaled_height;
  int scaled_width;
  int in_stack_000000b0;
  aom_codec_frame_buffer_t *in_stack_000000c0;
  aom_get_frame_buffer_cb_fn_t in_stack_000000c8;
  void *in_stack_000000d0;
  int in_stack_000000e0;
  int iVar7;
  undefined4 in_stack_ffffffffffffff64;
  YV12_BUFFER_CONFIG *ybf;
  undefined8 uVar8;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffff8c;
  _Bool local_6a;
  int local_68;
  _Bool local_51;
  YV12_BUFFER_CONFIG *local_10;
  
  if ((in_stack_00000008 & 1) == 0) {
    iVar5 = in_RDI->width;
    local_68 = in_RDI->height;
  }
  else {
    iVar5 = in_RDI->superres_upscaled_width;
    local_68 = in_RDI->superres_upscaled_height;
  }
  bVar6 = true;
  if (iVar5 == (in_RSI->field_2).field_0.y_crop_width) {
    bVar6 = local_68 != (in_RSI->field_3).field_0.y_crop_height;
  }
  local_10 = in_RSI;
  if (bVar6) {
    iVar2 = av1_num_planes(in_RDI);
    iVar7 = (in_RDI->features).byte_alignment;
    ybf = (YV12_BUFFER_CONFIG *)0x0;
    uVar8 = 0;
    uVar3 = (uint)(in_stack_00000018 & 1);
    uVar9 = 0;
    iVar4 = aom_realloc_frame_buffer
                      (in_stack_00000068,num_planes,in_stack_00000060,seq_params._4_4_,
                       (int)seq_params,in_stack_00000054,in_stack_000000b0,border_in_pixels,
                       in_stack_000000c0,in_stack_000000c8,in_stack_000000d0,in_stack_00000053,
                       in_stack_000000e0);
    if (iVar4 != 0) {
      aom_internal_error(in_RDI->error,AOM_CODEC_MEM_ERROR,"Failed to allocate scaled buffer");
    }
    local_51 = av1_has_optimized_scaler
                         ((in_RSI->field_2).field_0.y_crop_width,
                          (in_RSI->field_3).field_0.y_crop_height,iVar5,local_68);
    if (1 < iVar2) {
      local_6a = false;
      if (local_51) {
        local_6a = av1_has_optimized_scaler
                             ((in_RSI->field_2).field_0.uv_crop_width,
                              (in_RSI->field_3).field_0.uv_crop_height,
                              (in_RDX->field_2).field_0.uv_crop_width,
                              (in_RDX->field_3).field_0.uv_crop_height);
      }
      local_51 = local_6a;
    }
    if ((((in_R9B & 1) == 0) || (local_51 == false)) ||
       (in_RDI->seq_params->bit_depth != AOM_BITS_8)) {
      _Var1 = av1_resize_and_extend_frame_nonnormative
                        ((YV12_BUFFER_CONFIG *)CONCAT44(in_stack_ffffffffffffff8c,uVar9),
                         (YV12_BUFFER_CONFIG *)CONCAT44(in_stack_ffffffffffffff84,uVar3),
                         (int)((ulong)uVar8 >> 0x20),(int)uVar8);
      if (!_Var1) {
        aom_internal_error(in_RDI->error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate buffers during resize");
      }
    }
    else {
      (*av1_resize_and_extend_frame)(in_RSI,in_RDX,in_CL,in_R8D,iVar2);
    }
    local_10 = in_RDX;
    if ((in_RSI->metadata != (aom_metadata_array_t *)0x0) &&
       (iVar5 = aom_copy_metadata_to_frame_buffer
                          (ybf,(aom_metadata_array_t *)CONCAT44(in_stack_ffffffffffffff64,iVar7)),
       iVar5 != 0)) {
      aom_internal_error(in_RDI->error,AOM_CODEC_MEM_ERROR,
                         "Failed to copy source metadata to scaled frame");
    }
  }
  return local_10;
}

Assistant:

YV12_BUFFER_CONFIG *av1_realloc_and_scale_if_required(
    AV1_COMMON *cm, YV12_BUFFER_CONFIG *unscaled, YV12_BUFFER_CONFIG *scaled,
    const InterpFilter filter, const int phase, const bool use_optimized_scaler,
    const bool for_psnr, const int border_in_pixels, const bool alloc_pyramid) {
  // If scaling is performed for the sole purpose of calculating PSNR, then our
  // target dimensions are superres upscaled width/height. Otherwise our target
  // dimensions are coded width/height.
  const int scaled_width = for_psnr ? cm->superres_upscaled_width : cm->width;
  const int scaled_height =
      for_psnr ? cm->superres_upscaled_height : cm->height;
  const bool scaling_required = (scaled_width != unscaled->y_crop_width) ||
                                (scaled_height != unscaled->y_crop_height);

  if (scaling_required) {
    const int num_planes = av1_num_planes(cm);
    const SequenceHeader *seq_params = cm->seq_params;

    // Reallocate the frame buffer based on the target dimensions when scaling
    // is required.
    if (aom_realloc_frame_buffer(
            scaled, scaled_width, scaled_height, seq_params->subsampling_x,
            seq_params->subsampling_y, seq_params->use_highbitdepth,
            border_in_pixels, cm->features.byte_alignment, NULL, NULL, NULL,
            alloc_pyramid, 0))
      aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate scaled buffer");

    bool has_optimized_scaler = av1_has_optimized_scaler(
        unscaled->y_crop_width, unscaled->y_crop_height, scaled_width,
        scaled_height);
    if (num_planes > 1) {
      has_optimized_scaler = has_optimized_scaler &&
                             av1_has_optimized_scaler(unscaled->uv_crop_width,
                                                      unscaled->uv_crop_height,
                                                      scaled->uv_crop_width,
                                                      scaled->uv_crop_height);
    }

#if CONFIG_AV1_HIGHBITDEPTH
    if (use_optimized_scaler && has_optimized_scaler &&
        cm->seq_params->bit_depth == AOM_BITS_8) {
      av1_resize_and_extend_frame(unscaled, scaled, filter, phase, num_planes);
    } else {
      if (!av1_resize_and_extend_frame_nonnormative(
              unscaled, scaled, (int)cm->seq_params->bit_depth, num_planes))
        aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                           "Failed to allocate buffers during resize");
    }
#else
    if (use_optimized_scaler && has_optimized_scaler) {
      av1_resize_and_extend_frame(unscaled, scaled, filter, phase, num_planes);
    } else {
      if (!av1_resize_and_extend_frame_nonnormative(
              unscaled, scaled, (int)cm->seq_params->bit_depth, num_planes))
        aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                           "Failed to allocate buffers during resize");
    }
#endif
    if (unscaled->metadata &&
        aom_copy_metadata_to_frame_buffer(scaled, unscaled->metadata)) {
      aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                         "Failed to copy source metadata to scaled frame");
    }
    return scaled;
  }
  return unscaled;
}